

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O2

void Curl_cshutdn_setfds(cshutdn *cshutdn,Curl_easy *data,fd_set *read_fd_set,fd_set *write_fd_set,
                        int *maxfd)

{
  byte bVar1;
  Curl_llist_node *pCVar2;
  connectdata *conn;
  ulong uVar3;
  easy_pollset ps;
  
  pCVar2 = Curl_llist_head(&cshutdn->list);
  if (pCVar2 != (Curl_llist_node *)0x0) {
    for (pCVar2 = Curl_llist_head(&cshutdn->list); pCVar2 != (Curl_llist_node *)0x0;
        pCVar2 = Curl_node_next(pCVar2)) {
      conn = (connectdata *)Curl_node_elem(pCVar2);
      ps.sockets[0] = 0;
      ps.sockets[1] = 0;
      ps.sockets[2] = 0;
      ps.sockets[3] = 0;
      ps.sockets[4] = 0;
      ps.num = 0;
      ps.actions[0] = '\0';
      ps.actions[1] = '\0';
      ps.actions[2] = '\0';
      ps.actions[3] = '\0';
      ps.actions[4] = '\0';
      ps._29_3_ = 0;
      Curl_attach_connection(data,conn);
      Curl_conn_adjust_pollset(data,conn,&ps);
      Curl_detach_connection(data);
      for (uVar3 = 0; (ulong)ps._16_8_ >> 0x20 != uVar3; uVar3 = uVar3 + 1) {
        bVar1 = ps.actions[uVar3];
        if ((bVar1 & 1) != 0) {
          read_fd_set->fds_bits[ps.sockets[uVar3] / 0x40] =
               read_fd_set->fds_bits[ps.sockets[uVar3] / 0x40] |
               1L << ((byte)ps.sockets[uVar3] & 0x3f);
        }
        if ((bVar1 & 2) != 0) {
          write_fd_set->fds_bits[ps.sockets[uVar3] / 0x40] =
               write_fd_set->fds_bits[ps.sockets[uVar3] / 0x40] |
               1L << ((byte)ps.sockets[uVar3] & 0x3f);
        }
        if (((bVar1 & 3) != 0) && (*maxfd < ps.sockets[uVar3])) {
          *maxfd = ps.sockets[uVar3];
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_cshutdn_setfds(struct cshutdn *cshutdn,
                         struct Curl_easy *data,
                         fd_set *read_fd_set, fd_set *write_fd_set,
                         int *maxfd)
{
  if(Curl_llist_head(&cshutdn->list)) {
    struct Curl_llist_node *e;

    for(e = Curl_llist_head(&cshutdn->list); e;
        e = Curl_node_next(e)) {
      struct easy_pollset ps;
      unsigned int i;
      struct connectdata *conn = Curl_node_elem(e);
      memset(&ps, 0, sizeof(ps));
      Curl_attach_connection(data, conn);
      Curl_conn_adjust_pollset(data, conn, &ps);
      Curl_detach_connection(data);

      for(i = 0; i < ps.num; i++) {
#if defined(__DJGPP__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warith-conversion"
#endif
        if(ps.actions[i] & CURL_POLL_IN)
          FD_SET(ps.sockets[i], read_fd_set);
        if(ps.actions[i] & CURL_POLL_OUT)
          FD_SET(ps.sockets[i], write_fd_set);
#if defined(__DJGPP__)
#pragma GCC diagnostic pop
#endif
        if((ps.actions[i] & (CURL_POLL_OUT | CURL_POLL_IN)) &&
           ((int)ps.sockets[i] > *maxfd))
          *maxfd = (int)ps.sockets[i];
      }
    }
  }
}